

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O0

void __thiscall OPN2::setPatch(OPN2 *this,size_t c,OpnTimbre *instrument)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  reference pOVar4;
  byte *pbVar5;
  byte local_32;
  byte local_31;
  uint32_t local_30;
  uint8_t op;
  uint8_t d;
  uint32_t cc;
  uint8_t port;
  size_t chip;
  OpnTimbre *instrument_local;
  size_t c_local;
  OPN2 *this_local;
  
  chip = (size_t)instrument;
  instrument_local = (OpnTimbre *)c;
  c_local = (size_t)this;
  getOpnChannel(c,(size_t *)&cc,&d,&local_30);
  sVar3 = chip;
  pOVar4 = std::vector<OpnTimbre,_std::allocator<OpnTimbre>_>::operator[]
                     (&this->m_insCache,(size_type)instrument_local);
  *(undefined8 *)pOVar4->OPS = *(undefined8 *)sVar3;
  *(undefined8 *)(pOVar4->OPS[1].data + 1) = *(undefined8 *)(sVar3 + 8);
  *(undefined8 *)(pOVar4->OPS[2].data + 2) = *(undefined8 *)(sVar3 + 0x10);
  *(undefined8 *)(pOVar4->OPS[3].data + 3) = *(undefined8 *)(sVar3 + 0x18);
  for (local_31 = 0; local_31 < 7; local_31 = local_31 + 1) {
    for (local_32 = 0; local_32 < 4; local_32 = local_32 + 1) {
      writeRegI(this,_cc,d,(uint)local_31 * 0x10 + 0x30 + (uint)local_32 * 4 + local_30,
                (uint)*(byte *)(chip + (ulong)local_32 * 7 + (ulong)local_31));
    }
  }
  writeRegI(this,_cc,d,local_30 + 0xb0,(uint)*(byte *)(chip + 0x1c));
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_regLFOSens,(size_type)instrument_local);
  bVar1 = *pbVar5;
  bVar2 = *(byte *)(chip + 0x1d);
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_regLFOSens,(size_type)instrument_local);
  *pbVar5 = bVar1 & 0xc0 | bVar2 & 0x3f;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_regLFOSens,(size_type)instrument_local);
  writeRegI(this,_cc,d,local_30 + 0xb4,(uint)*pbVar5);
  return;
}

Assistant:

void OPN2::setPatch(size_t c, const OpnTimbre &instrument)
{
    size_t      chip;
    uint8_t     port;
    uint32_t    cc;
    getOpnChannel(c, chip, port, cc);
    m_insCache[c] = instrument;
    for(uint8_t d = 0; d < 7; d++)
    {
        for(uint8_t op = 0; op < 4; op++)
            writeRegI(chip, port, 0x30 + (0x10 * d) + (op * 4) + cc, instrument.OPS[op].data[d]);
    }

    writeRegI(chip, port, 0xB0 + cc, instrument.fbalg);//Feedback/Algorithm
    m_regLFOSens[c] = (m_regLFOSens[c] & 0xC0) | (instrument.lfosens & 0x3F);
    writeRegI(chip, port, 0xB4 + cc, m_regLFOSens[c]);//Panorame and LFO bits
}